

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O3

int __thiscall DIS::SeesPdu::getMarshalledSize(SeesPdu *this)

{
  int iVar1;
  int iVar2;
  pointer pPVar3;
  pointer pVVar4;
  ulong uVar5;
  long lVar6;
  PropulsionSystemData listElement;
  PropulsionSystemData local_40;
  
  iVar1 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_orginatingEntityID);
  iVar1 = iVar1 + iVar2 + 10;
  pPVar3 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_propulsionSystemData).
      super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar3) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      local_40._vptr_PropulsionSystemData = (_func_int **)&PTR__PropulsionSystemData_001b58d8;
      local_40._8_8_ = *(undefined8 *)((long)&pPVar3->_vptr_PropulsionSystemData + lVar6);
      iVar2 = PropulsionSystemData::getMarshalledSize(&local_40);
      iVar1 = iVar1 + iVar2;
      PropulsionSystemData::~PropulsionSystemData(&local_40);
      uVar5 = uVar5 + 1;
      pPVar3 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_propulsionSystemData).
                                   super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4));
  }
  pVVar4 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vectoringSystemData).
      super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar4) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      local_40._vptr_PropulsionSystemData = (_func_int **)&PTR__VectoringNozzleSystem_001b67d8;
      local_40._8_8_ = *(undefined8 *)((long)&pVVar4->_vptr_VectoringNozzleSystem + lVar6);
      iVar2 = VectoringNozzleSystem::getMarshalledSize((VectoringNozzleSystem *)&local_40);
      iVar1 = iVar1 + iVar2;
      VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
      uVar5 = uVar5 + 1;
      pVVar4 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_vectoringSystemData).
                                   super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4));
  }
  return iVar1;
}

Assistant:

int SeesPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _orginatingEntityID.getMarshalledSize();  // _orginatingEntityID
   marshalSize = marshalSize + 2;  // _infraredSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _acousticSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _radarCrossSectionSignatureRepresentationIndex
   marshalSize = marshalSize + 2;  // _numberOfPropulsionSystems
   marshalSize = marshalSize + 2;  // _numberOfVectoringNozzleSystems

   for(unsigned long long idx=0; idx < _propulsionSystemData.size(); idx++)
   {
        PropulsionSystemData listElement = _propulsionSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _vectoringSystemData.size(); idx++)
   {
        VectoringNozzleSystem listElement = _vectoringSystemData[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}